

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeSpan.h
# Opt level: O1

string * __thiscall
libsgp4::TimeSpan::ToString_abi_cxx11_(string *__return_storage_ptr__,TimeSpan *this)

{
  undefined1 auVar1 [16];
  char cVar2;
  ostream *poVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  stringstream ss;
  undefined1 auStack_1b8 [15];
  char local_1a9;
  stringstream local_1a8 [16];
  long local_198 [2];
  undefined8 uStack_188;
  uint auStack_180 [22];
  ios_base local_128 [112];
  char acStack_b8 [152];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) =
       *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) & 0xffffff4f | 0x80;
  lVar4 = *(long *)(local_198[0] + -0x18);
  if (acStack_b8[lVar4 + 1] == '\0') {
    cVar2 = std::ios::widen((char)auStack_1b8 + (char)lVar4 + ' ');
    acStack_b8[lVar4] = cVar2;
    acStack_b8[lVar4 + 1] = '\x01';
  }
  acStack_b8[lVar4] = '0';
  if (this->m_ticks < 0) {
    local_1a9 = '-';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,&local_1a9,1);
  }
  if (0x283baebffe < this->m_ticks + 86399999999U) {
    iVar6 = (int)(this->m_ticks / 86400000000);
    *(undefined8 *)((long)&uStack_188 + *(long *)(local_198[0] + -0x18)) = 2;
    iVar5 = -iVar6;
    if (0 < iVar6) {
      iVar5 = iVar6;
    }
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_198,iVar5);
    local_1a9 = '.';
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_1a9,1);
  }
  *(undefined8 *)((long)&uStack_188 + *(long *)(local_198[0] + -0x18)) = 2;
  auVar1 = SEXT816(this->m_ticks % 86400000000) * ZEXT816(0x98b5bf2c03e529c5);
  iVar5 = (int)(auVar1._8_8_ >> 0x1f) - (auVar1._12_4_ >> 0x1f);
  iVar6 = -iVar5;
  if (0 < iVar5) {
    iVar6 = iVar5;
  }
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_198,iVar6);
  local_1a9 = ':';
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_1a9,1);
  *(undefined8 *)((long)&uStack_188 + *(long *)(local_198[0] + -0x18)) = 2;
  auVar1 = SEXT816(this->m_ticks % 3600000000) * ZEXT816(0x8f2a633943a6d729);
  iVar5 = (int)(auVar1._8_8_ >> 0x19) - (auVar1._12_4_ >> 0x1f);
  iVar6 = -iVar5;
  if (0 < iVar5) {
    iVar6 = iVar5;
  }
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_198,iVar6);
  local_1a9 = ':';
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_1a9,1);
  *(undefined8 *)((long)&uStack_188 + *(long *)(local_198[0] + -0x18)) = 2;
  auVar1 = SEXT816(this->m_ticks % 60000000) * SEXT816(0x431bde82d7b634db);
  iVar5 = (int)(auVar1._8_8_ >> 0x12) - (auVar1._12_4_ >> 0x1f);
  iVar6 = -iVar5;
  if (0 < iVar5) {
    iVar6 = iVar5;
  }
  std::ostream::operator<<((ostream *)local_198,iVar6);
  lVar4 = this->m_ticks * 0x790fb65668c26139;
  if (0x10c6f7a0b5ec < (lVar4 + 0x218def416bd80U >> 6 | lVar4 << 0x3a)) {
    local_1a9 = '.';
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,&local_1a9,1);
    *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 6;
    auVar1 = SEXT816(this->m_ticks) * SEXT816(0x431bde82d7b634db);
    iVar5 = (int)this->m_ticks + ((int)(auVar1._8_8_ >> 0x12) - (auVar1._12_4_ >> 0x1f)) * -1000000;
    iVar6 = -iVar5;
    if (0 < iVar5) {
      iVar6 = iVar5;
    }
    std::ostream::operator<<((ostream *)poVar3,iVar6);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const
    {
        std::stringstream ss;

        ss << std::right << std::setfill('0');
        
        if (m_ticks < 0)
        {
            ss << '-';
        }

        if (Days() != 0)
        {
            ss << std::setw(2) << std::abs(Days()) << '.';
        }

        ss << std::setw(2) << std::abs(Hours()) << ':';
        ss << std::setw(2) << std::abs(Minutes()) << ':';
        ss << std::setw(2) << std::abs(Seconds());

        if (Microseconds() != 0)
        {
            ss << '.' << std::setw(6) << std::abs(Microseconds());
        }

        return ss.str();
    }